

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  ulong uVar16;
  RayHitK<4> *pRVar17;
  Scene *pSVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong unaff_R12;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  float fVar37;
  float fVar38;
  undefined8 extraout_XMM1_Qa;
  float fVar52;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar51;
  float fVar54;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar53;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 extraout_var [56];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar64;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  float fVar76;
  float fVar79;
  undefined1 auVar67 [16];
  float fVar81;
  undefined1 auVar68 [16];
  float fVar77;
  float fVar80;
  float fVar82;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar78;
  float fVar83;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar116;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar114;
  float fVar115;
  undefined1 auVar113 [64];
  float fVar117;
  undefined1 auVar118 [16];
  float fVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar126 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar139 [64];
  undefined1 auVar143 [64];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  float fVar150;
  float fVar155;
  undefined1 auVar151 [16];
  float fVar153;
  float fVar154;
  undefined1 auVar152 [64];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27b9;
  ulong local_27b8;
  ulong local_27b0;
  RayHitK<4> *local_27a8;
  undefined1 local_27a0 [16];
  undefined8 local_2790;
  float fStack_2788;
  float fStack_2784;
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  long local_2758;
  long local_2750;
  ulong local_2748;
  undefined8 local_2740;
  float fStack_2738;
  float fStack_2734;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 *local_2718;
  ulong local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  undefined8 *local_26f0;
  void *local_26e8;
  RTCRayQueryContext *local_26e0;
  RayHitK<4> *local_26d8;
  undefined1 (*local_26d0) [16];
  undefined4 local_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [16];
  undefined1 *local_2690;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [2] [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar22 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar28;
  local_23c0._0_4_ = uVar28;
  local_23c0._8_4_ = uVar28;
  local_23c0._12_4_ = uVar28;
  local_23c0._16_4_ = uVar28;
  local_23c0._20_4_ = uVar28;
  local_23c0._24_4_ = uVar28;
  local_23c0._28_4_ = uVar28;
  auVar104 = ZEXT3264(local_23c0);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar28;
  local_23e0._0_4_ = uVar28;
  local_23e0._8_4_ = uVar28;
  local_23e0._12_4_ = uVar28;
  local_23e0._16_4_ = uVar28;
  local_23e0._20_4_ = uVar28;
  local_23e0._24_4_ = uVar28;
  local_23e0._28_4_ = uVar28;
  auVar113 = ZEXT3264(local_23e0);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar28;
  local_2400._0_4_ = uVar28;
  local_2400._8_4_ = uVar28;
  local_2400._12_4_ = uVar28;
  local_2400._16_4_ = uVar28;
  local_2400._20_4_ = uVar28;
  local_2400._24_4_ = uVar28;
  local_2400._28_4_ = uVar28;
  auVar126 = ZEXT3264(local_2400);
  fVar37 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar51 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar33 = ZEXT416((uint)(fVar37 * 0.99999964));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_2420._16_16_ = auVar33;
  local_2420._0_16_ = auVar33;
  auVar132 = ZEXT3264(local_2420);
  auVar33 = ZEXT416((uint)(fVar38 * 0.99999964));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_2440._16_16_ = auVar33;
  local_2440._0_16_ = auVar33;
  auVar134 = ZEXT3264(local_2440);
  auVar33 = ZEXT416((uint)(fVar51 * 0.99999964));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_2460._16_16_ = auVar33;
  local_2460._0_16_ = auVar33;
  auVar139 = ZEXT3264(local_2460);
  auVar33 = ZEXT416((uint)(fVar37 * 1.0000004));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_2480._16_16_ = auVar33;
  local_2480._0_16_ = auVar33;
  auVar143 = ZEXT3264(local_2480);
  auVar33 = ZEXT416((uint)(fVar38 * 1.0000004));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_24a0._16_16_ = auVar33;
  local_24a0._0_16_ = auVar33;
  auVar146 = ZEXT3264(local_24a0);
  auVar33 = ZEXT416((uint)(fVar51 * 1.0000004));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_24c0._16_16_ = auVar33;
  local_24c0._0_16_ = auVar33;
  auVar152 = ZEXT3264(local_24c0);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2710 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_26f8 = uVar23 ^ 0x20;
  local_2700 = uVar27 ^ 0x20;
  iVar15 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar15;
  local_2600._0_4_ = iVar15;
  local_2600._8_4_ = iVar15;
  local_2600._12_4_ = iVar15;
  local_2600._16_4_ = iVar15;
  local_2600._20_4_ = iVar15;
  local_2600._24_4_ = iVar15;
  local_2600._28_4_ = iVar15;
  auVar158 = ZEXT3264(local_2600);
  iVar15 = (tray->tfar).field_0.i[k];
  auVar36 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,CONCAT412(
                                                  iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15)))))
                                               )));
  local_2708 = local_2710 ^ 0x20;
  local_2718 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar16 = local_2710;
  local_27b8 = uVar27;
  local_27b0 = uVar23;
  local_27a8 = ray;
  do {
    do {
      do {
        if (pauVar22 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar20 = pauVar22 + -1;
        pauVar22 = pauVar22 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar20 + 8));
      uVar31 = *(ulong *)*pauVar22;
      do {
        auVar125 = auVar126._0_32_;
        auVar112 = auVar113._0_32_;
        auVar103 = auVar104._0_32_;
        if ((uVar31 & 8) == 0) {
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar23),auVar103);
          auVar7._4_4_ = auVar132._4_4_ * auVar6._4_4_;
          auVar7._0_4_ = auVar132._0_4_ * auVar6._0_4_;
          auVar7._8_4_ = auVar132._8_4_ * auVar6._8_4_;
          auVar7._12_4_ = auVar132._12_4_ * auVar6._12_4_;
          auVar7._16_4_ = auVar132._16_4_ * auVar6._16_4_;
          auVar7._20_4_ = auVar132._20_4_ * auVar6._20_4_;
          auVar7._24_4_ = auVar132._24_4_ * auVar6._24_4_;
          auVar7._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar27),auVar112);
          auVar8._4_4_ = auVar134._4_4_ * auVar6._4_4_;
          auVar8._0_4_ = auVar134._0_4_ * auVar6._0_4_;
          auVar8._8_4_ = auVar134._8_4_ * auVar6._8_4_;
          auVar8._12_4_ = auVar134._12_4_ * auVar6._12_4_;
          auVar8._16_4_ = auVar134._16_4_ * auVar6._16_4_;
          auVar8._20_4_ = auVar134._20_4_ * auVar6._20_4_;
          auVar8._24_4_ = auVar134._24_4_ * auVar6._24_4_;
          auVar8._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar7,auVar8);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar16),auVar125);
          auVar9._4_4_ = auVar139._4_4_ * auVar7._4_4_;
          auVar9._0_4_ = auVar139._0_4_ * auVar7._0_4_;
          auVar9._8_4_ = auVar139._8_4_ * auVar7._8_4_;
          auVar9._12_4_ = auVar139._12_4_ * auVar7._12_4_;
          auVar9._16_4_ = auVar139._16_4_ * auVar7._16_4_;
          auVar9._20_4_ = auVar139._20_4_ * auVar7._20_4_;
          auVar9._24_4_ = auVar139._24_4_ * auVar7._24_4_;
          auVar9._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar9,auVar158._0_32_);
          local_26c0 = vmaxps_avx(auVar6,auVar7);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + local_26f8),auVar103);
          auVar10._4_4_ = auVar143._4_4_ * auVar6._4_4_;
          auVar10._0_4_ = auVar143._0_4_ * auVar6._0_4_;
          auVar10._8_4_ = auVar143._8_4_ * auVar6._8_4_;
          auVar10._12_4_ = auVar143._12_4_ * auVar6._12_4_;
          auVar10._16_4_ = auVar143._16_4_ * auVar6._16_4_;
          auVar10._20_4_ = auVar143._20_4_ * auVar6._20_4_;
          auVar10._24_4_ = auVar143._24_4_ * auVar6._24_4_;
          auVar10._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + local_2700),auVar112);
          auVar11._4_4_ = auVar146._4_4_ * auVar6._4_4_;
          auVar11._0_4_ = auVar146._0_4_ * auVar6._0_4_;
          auVar11._8_4_ = auVar146._8_4_ * auVar6._8_4_;
          auVar11._12_4_ = auVar146._12_4_ * auVar6._12_4_;
          auVar11._16_4_ = auVar146._16_4_ * auVar6._16_4_;
          auVar11._20_4_ = auVar146._20_4_ * auVar6._20_4_;
          auVar11._24_4_ = auVar146._24_4_ * auVar6._24_4_;
          auVar11._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar10,auVar11);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + local_2708),auVar125);
          auVar12._4_4_ = auVar152._4_4_ * auVar7._4_4_;
          auVar12._0_4_ = auVar152._0_4_ * auVar7._0_4_;
          auVar12._8_4_ = auVar152._8_4_ * auVar7._8_4_;
          auVar12._12_4_ = auVar152._12_4_ * auVar7._12_4_;
          auVar12._16_4_ = auVar152._16_4_ * auVar7._16_4_;
          auVar12._20_4_ = auVar152._20_4_ * auVar7._20_4_;
          auVar12._24_4_ = auVar152._24_4_ * auVar7._24_4_;
          auVar12._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar12,auVar36._0_32_);
          auVar6 = vminps_avx(auVar6,auVar7);
          auVar6 = vcmpps_avx(local_26c0,auVar6,2);
          uVar28 = vmovmskps_avx(auVar6);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar28);
        }
        if ((uVar31 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar15 = 4;
          }
          else {
            uVar30 = uVar31 & 0xfffffffffffffff0;
            lVar19 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            iVar15 = 0;
            uVar31 = *(ulong *)(uVar30 + lVar19 * 8);
            uVar25 = unaff_R12 - 1 & unaff_R12;
            if (uVar25 != 0) {
              uVar3 = *(uint *)(local_26c0 + lVar19 * 4);
              lVar19 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              uVar4 = *(ulong *)(uVar30 + lVar19 * 8);
              uVar2 = *(uint *)(local_26c0 + lVar19 * 4);
              uVar25 = uVar25 - 1 & uVar25;
              uVar23 = local_27b0;
              uVar27 = local_27b8;
              if (uVar25 == 0) {
                if (uVar3 < uVar2) {
                  *(ulong *)*pauVar22 = uVar4;
                  *(uint *)(*pauVar22 + 8) = uVar2;
                  pauVar22 = pauVar22 + 1;
                }
                else {
                  *(ulong *)*pauVar22 = uVar31;
                  *(uint *)(*pauVar22 + 8) = uVar3;
                  pauVar22 = pauVar22 + 1;
                  uVar31 = uVar4;
                }
              }
              else {
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar31;
                auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar3));
                auVar55._8_8_ = 0;
                auVar55._0_8_ = uVar4;
                auVar55 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar2));
                lVar19 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar67._8_8_ = 0;
                auVar67._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
                auVar39 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_26c0 + lVar19 * 4)));
                auVar67 = vpcmpgtd_avx(auVar55,auVar33);
                uVar25 = uVar25 - 1 & uVar25;
                if (uVar25 == 0) {
                  auVar92 = vpshufd_avx(auVar67,0xaa);
                  auVar67 = vblendvps_avx(auVar55,auVar33,auVar92);
                  auVar33 = vblendvps_avx(auVar33,auVar55,auVar92);
                  auVar55 = vpcmpgtd_avx(auVar39,auVar67);
                  auVar92 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar39,auVar67,auVar92);
                  auVar67 = vblendvps_avx(auVar67,auVar39,auVar92);
                  auVar39 = vpcmpgtd_avx(auVar67,auVar33);
                  auVar92 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar67,auVar33,auVar92);
                  auVar33 = vblendvps_avx(auVar33,auVar67,auVar92);
                  *pauVar22 = auVar33;
                  pauVar22[1] = auVar39;
                  uVar31 = auVar55._0_8_;
                  pauVar22 = pauVar22 + 2;
                }
                else {
                  lVar19 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                    }
                  }
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
                  auVar92 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_26c0 + lVar19 * 4)));
                  uVar25 = uVar25 - 1 & uVar25;
                  if (uVar25 == 0) {
                    auVar40 = vpshufd_avx(auVar67,0xaa);
                    auVar67 = vblendvps_avx(auVar55,auVar33,auVar40);
                    auVar33 = vblendvps_avx(auVar33,auVar55,auVar40);
                    auVar55 = vpcmpgtd_avx(auVar92,auVar39);
                    auVar40 = vpshufd_avx(auVar55,0xaa);
                    auVar55 = vblendvps_avx(auVar92,auVar39,auVar40);
                    auVar39 = vblendvps_avx(auVar39,auVar92,auVar40);
                    auVar92 = vpcmpgtd_avx(auVar39,auVar33);
                    auVar40 = vpshufd_avx(auVar92,0xaa);
                    auVar92 = vblendvps_avx(auVar39,auVar33,auVar40);
                    auVar33 = vblendvps_avx(auVar33,auVar39,auVar40);
                    auVar39 = vpcmpgtd_avx(auVar55,auVar67);
                    auVar40 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar55,auVar67,auVar40);
                    auVar55 = vblendvps_avx(auVar67,auVar55,auVar40);
                    auVar67 = vpcmpgtd_avx(auVar92,auVar55);
                    auVar40 = vpshufd_avx(auVar67,0xaa);
                    auVar67 = vblendvps_avx(auVar92,auVar55,auVar40);
                    auVar55 = vblendvps_avx(auVar55,auVar92,auVar40);
                    *pauVar22 = auVar33;
                    pauVar22[1] = auVar55;
                    pauVar22[2] = auVar67;
                    uVar31 = auVar39._0_8_;
                    pauVar20 = pauVar22 + 3;
                  }
                  else {
                    *pauVar22 = auVar33;
                    pauVar22[1] = auVar55;
                    pauVar22[2] = auVar39;
                    pauVar22[3] = auVar92;
                    lVar19 = 0x30;
                    do {
                      lVar26 = lVar19;
                      lVar19 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                        }
                      }
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ = *(ulong *)(uVar30 + lVar19 * 8);
                      auVar33 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_26c0 + lVar19 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar22[1] + lVar26) = auVar33;
                      uVar25 = uVar25 & uVar25 - 1;
                      lVar19 = lVar26 + 0x10;
                    } while (uVar25 != 0);
                    pauVar20 = (undefined1 (*) [16])(pauVar22[1] + lVar26);
                    if (lVar26 + 0x10 != 0) {
                      lVar19 = 0x10;
                      pauVar21 = pauVar22;
                      do {
                        auVar33 = pauVar21[1];
                        uVar3 = *(uint *)(pauVar21[1] + 8);
                        pauVar21 = pauVar21 + 1;
                        lVar26 = lVar19;
                        do {
                          if (uVar3 <= *(uint *)(pauVar22[-1] + lVar26 + 8)) {
                            pauVar24 = (undefined1 (*) [16])(*pauVar22 + lVar26);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar22 + lVar26) =
                               *(undefined1 (*) [16])(pauVar22[-1] + lVar26);
                          lVar26 = lVar26 + -0x10;
                          pauVar24 = pauVar22;
                        } while (lVar26 != 0);
                        *pauVar24 = auVar33;
                        lVar19 = lVar19 + 0x10;
                      } while (pauVar20 != pauVar21);
                    }
                    uVar31 = *(ulong *)*pauVar20;
                  }
                  auVar104 = ZEXT3264(auVar103);
                  auVar113 = ZEXT3264(auVar112);
                  auVar126 = ZEXT3264(auVar125);
                  auVar132 = ZEXT3264(auVar132._0_32_);
                  auVar134 = ZEXT3264(auVar134._0_32_);
                  auVar139 = ZEXT3264(auVar139._0_32_);
                  auVar143 = ZEXT3264(auVar143._0_32_);
                  auVar146 = ZEXT3264(auVar146._0_32_);
                  auVar152 = ZEXT3264(auVar152._0_32_);
                  auVar158 = ZEXT3264(local_2600);
                  pauVar22 = pauVar20;
                  ray = local_27a8;
                  iVar15 = 0;
                }
              }
            }
          }
        }
        else {
          iVar15 = 6;
        }
      } while (iVar15 == 0);
    } while (iVar15 != 6);
    lVar19 = (ulong)((uint)uVar31 & 0xf) - 8;
    if (lVar19 != 0) {
      uVar31 = uVar31 & 0xfffffffffffffff0;
      lVar26 = 0;
      local_2748 = unaff_R12;
      do {
        lVar32 = lVar26 * 0xb0;
        local_2690 = &local_27b9;
        uVar28 = *(undefined4 *)(ray + k * 4);
        auVar40._4_4_ = uVar28;
        auVar40._0_4_ = uVar28;
        auVar40._8_4_ = uVar28;
        auVar40._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar56._4_4_ = uVar28;
        auVar56._0_4_ = uVar28;
        auVar56._8_4_ = uVar28;
        auVar56._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar85._4_4_ = uVar28;
        auVar85._0_4_ = uVar28;
        auVar85._8_4_ = uVar28;
        auVar85._12_4_ = uVar28;
        local_2560 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + lVar32),auVar40);
        local_2570 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x10 + lVar32),auVar56);
        local_2580 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + lVar32),auVar85);
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x30 + lVar32),auVar40);
        auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x40 + lVar32),auVar56);
        auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x50 + lVar32),auVar85);
        auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x60 + lVar32),auVar40);
        auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x70 + lVar32),auVar56);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x80 + lVar32),auVar85);
        local_2590 = vsubps_avx(auVar39,local_2560);
        local_25a0 = vsubps_avx(auVar92,local_2570);
        local_25b0 = vsubps_avx(auVar40,local_2580);
        fVar65 = local_2570._0_4_;
        fVar37 = fVar65 + auVar92._0_4_;
        fVar76 = local_2570._4_4_;
        fVar51 = fVar76 + auVar92._4_4_;
        fVar79 = local_2570._8_4_;
        fVar52 = fVar79 + auVar92._8_4_;
        fVar81 = local_2570._12_4_;
        fVar54 = fVar81 + auVar92._12_4_;
        fVar150 = local_2580._0_4_;
        fVar84 = fVar150 + auVar40._0_4_;
        fVar153 = local_2580._4_4_;
        fVar88 = fVar153 + auVar40._4_4_;
        fVar154 = local_2580._8_4_;
        fVar89 = fVar154 + auVar40._8_4_;
        fVar155 = local_2580._12_4_;
        fVar90 = fVar155 + auVar40._12_4_;
        fVar38 = local_25b0._0_4_;
        auVar118._0_4_ = fVar37 * fVar38;
        fVar53 = local_25b0._4_4_;
        auVar118._4_4_ = fVar51 * fVar53;
        fVar78 = local_25b0._8_4_;
        auVar118._8_4_ = fVar52 * fVar78;
        fVar83 = local_25b0._12_4_;
        auVar118._12_4_ = fVar54 * fVar83;
        fVar156 = local_25a0._0_4_;
        auVar130._0_4_ = fVar156 * fVar84;
        fVar159 = local_25a0._4_4_;
        auVar130._4_4_ = fVar159 * fVar88;
        fVar161 = local_25a0._8_4_;
        auVar130._8_4_ = fVar161 * fVar89;
        fVar163 = local_25a0._12_4_;
        auVar130._12_4_ = fVar163 * fVar90;
        auVar56 = vsubps_avx(auVar130,auVar118);
        fVar105 = local_2560._0_4_;
        fVar117 = fVar105 + auVar39._0_4_;
        fVar114 = local_2560._4_4_;
        fVar127 = fVar114 + auVar39._4_4_;
        fVar115 = local_2560._8_4_;
        fVar128 = fVar115 + auVar39._8_4_;
        fVar116 = local_2560._12_4_;
        fVar129 = fVar116 + auVar39._12_4_;
        fVar133 = local_2590._0_4_;
        auVar86._0_4_ = fVar133 * fVar84;
        fVar135 = local_2590._4_4_;
        auVar86._4_4_ = fVar135 * fVar88;
        fVar136 = local_2590._8_4_;
        auVar86._8_4_ = fVar136 * fVar89;
        fVar137 = local_2590._12_4_;
        auVar86._12_4_ = fVar137 * fVar90;
        auVar131._0_4_ = fVar117 * fVar38;
        auVar131._4_4_ = fVar127 * fVar53;
        auVar131._8_4_ = fVar128 * fVar78;
        auVar131._12_4_ = fVar129 * fVar83;
        auVar57 = vsubps_avx(auVar131,auVar86);
        auVar119._0_4_ = fVar117 * fVar156;
        auVar119._4_4_ = fVar127 * fVar159;
        auVar119._8_4_ = fVar128 * fVar161;
        auVar119._12_4_ = fVar129 * fVar163;
        auVar41._0_4_ = fVar133 * fVar37;
        auVar41._4_4_ = fVar135 * fVar51;
        auVar41._8_4_ = fVar136 * fVar52;
        auVar41._12_4_ = fVar137 * fVar54;
        auVar41 = vsubps_avx(auVar41,auVar119);
        local_2790._4_4_ = *(float *)(ray + k * 4 + 0x60);
        fStack_2738 = *(float *)(ray + k * 4 + 0x50);
        local_2740 = (undefined1 (*) [16])CONCAT44(fStack_2738,fStack_2738);
        fVar37 = *(float *)(ray + k * 4 + 0x40);
        local_2780._0_4_ =
             auVar56._0_4_ * fVar37 + local_2790._4_4_ * auVar41._0_4_ + fStack_2738 * auVar57._0_4_
        ;
        local_2780._4_4_ =
             auVar56._4_4_ * fVar37 + local_2790._4_4_ * auVar41._4_4_ + fStack_2738 * auVar57._4_4_
        ;
        local_2780._8_4_ =
             auVar56._8_4_ * fVar37 + local_2790._4_4_ * auVar41._8_4_ + fStack_2738 * auVar57._8_4_
        ;
        local_2780._12_4_ =
             auVar56._12_4_ * fVar37 +
             local_2790._4_4_ * auVar41._12_4_ + fStack_2738 * auVar57._12_4_;
        local_25c0 = vsubps_avx(local_2570,auVar55);
        auVar56 = vsubps_avx(local_2580,auVar67);
        fVar51 = auVar55._0_4_ + fVar65;
        fVar52 = auVar55._4_4_ + fVar76;
        fVar54 = auVar55._8_4_ + fVar79;
        fVar84 = auVar55._12_4_ + fVar81;
        fVar88 = fVar150 + auVar67._0_4_;
        fVar89 = fVar153 + auVar67._4_4_;
        fVar90 = fVar154 + auVar67._8_4_;
        fVar117 = fVar155 + auVar67._12_4_;
        fVar157 = auVar56._0_4_;
        auVar151._0_4_ = fVar157 * fVar51;
        fVar160 = auVar56._4_4_;
        auVar151._4_4_ = fVar160 * fVar52;
        fVar162 = auVar56._8_4_;
        auVar151._8_4_ = fVar162 * fVar54;
        fVar164 = auVar56._12_4_;
        auVar151._12_4_ = fVar164 * fVar84;
        fVar144 = local_25c0._0_4_;
        auVar68._0_4_ = fVar144 * fVar88;
        fVar147 = local_25c0._4_4_;
        auVar68._4_4_ = fVar147 * fVar89;
        fVar148 = local_25c0._8_4_;
        auVar68._8_4_ = fVar148 * fVar90;
        fVar149 = local_25c0._12_4_;
        auVar68._12_4_ = fVar149 * fVar117;
        auVar56 = vsubps_avx(auVar68,auVar151);
        auVar57 = vsubps_avx(local_2560,auVar33);
        fVar138 = auVar57._0_4_;
        auVar87._0_4_ = fVar138 * fVar88;
        fVar140 = auVar57._4_4_;
        auVar87._4_4_ = fVar140 * fVar89;
        fVar141 = auVar57._8_4_;
        auVar87._8_4_ = fVar141 * fVar90;
        fVar142 = auVar57._12_4_;
        auVar87._12_4_ = fVar142 * fVar117;
        fVar88 = auVar33._0_4_ + fVar105;
        fVar89 = auVar33._4_4_ + fVar114;
        fVar90 = auVar33._8_4_ + fVar115;
        fVar117 = auVar33._12_4_ + fVar116;
        auVar120._0_4_ = fVar157 * fVar88;
        auVar120._4_4_ = fVar160 * fVar89;
        auVar120._8_4_ = fVar162 * fVar90;
        auVar120._12_4_ = fVar164 * fVar117;
        auVar57 = vsubps_avx(auVar120,auVar87);
        auVar106._0_4_ = fVar144 * fVar88;
        auVar106._4_4_ = fVar147 * fVar89;
        auVar106._8_4_ = fVar148 * fVar90;
        auVar106._12_4_ = fVar149 * fVar117;
        auVar42._0_4_ = fVar138 * fVar51;
        auVar42._4_4_ = fVar140 * fVar52;
        auVar42._8_4_ = fVar141 * fVar54;
        auVar42._12_4_ = fVar142 * fVar84;
        auVar41 = vsubps_avx(auVar42,auVar106);
        local_25d0._0_4_ =
             fVar37 * auVar56._0_4_ + local_2790._4_4_ * auVar41._0_4_ + fStack_2738 * auVar57._0_4_
        ;
        local_25d0._4_4_ =
             fVar37 * auVar56._4_4_ + local_2790._4_4_ * auVar41._4_4_ + fStack_2738 * auVar57._4_4_
        ;
        local_25d0._8_4_ =
             fVar37 * auVar56._8_4_ + local_2790._4_4_ * auVar41._8_4_ + fStack_2738 * auVar57._8_4_
        ;
        local_25d0._12_4_ =
             fVar37 * auVar56._12_4_ +
             local_2790._4_4_ * auVar41._12_4_ + fStack_2738 * auVar57._12_4_;
        auVar56 = vsubps_avx(auVar33,auVar39);
        fVar66 = auVar33._0_4_ + auVar39._0_4_;
        fVar77 = auVar33._4_4_ + auVar39._4_4_;
        fVar80 = auVar33._8_4_ + auVar39._8_4_;
        fVar82 = auVar33._12_4_ + auVar39._12_4_;
        auVar33 = vsubps_avx(auVar55,auVar92);
        fVar91 = auVar55._0_4_ + auVar92._0_4_;
        fVar97 = auVar55._4_4_ + auVar92._4_4_;
        fVar98 = auVar55._8_4_ + auVar92._8_4_;
        fVar99 = auVar55._12_4_ + auVar92._12_4_;
        auVar55 = vsubps_avx(auVar67,auVar40);
        fVar127 = auVar67._0_4_ + auVar40._0_4_;
        fVar128 = auVar67._4_4_ + auVar40._4_4_;
        fVar129 = auVar67._8_4_ + auVar40._8_4_;
        fVar64 = auVar67._12_4_ + auVar40._12_4_;
        fVar51 = auVar55._0_4_;
        auVar107._0_4_ = fVar91 * fVar51;
        fVar52 = auVar55._4_4_;
        auVar107._4_4_ = fVar97 * fVar52;
        fVar54 = auVar55._8_4_;
        auVar107._8_4_ = fVar98 * fVar54;
        fVar84 = auVar55._12_4_;
        auVar107._12_4_ = fVar99 * fVar84;
        fVar88 = auVar33._0_4_;
        auVar121._0_4_ = fVar88 * fVar127;
        fVar89 = auVar33._4_4_;
        auVar121._4_4_ = fVar89 * fVar128;
        fVar90 = auVar33._8_4_;
        auVar121._8_4_ = fVar90 * fVar129;
        fVar117 = auVar33._12_4_;
        auVar121._12_4_ = fVar117 * fVar64;
        auVar33 = vsubps_avx(auVar121,auVar107);
        fVar145 = auVar56._0_4_;
        auVar57._0_4_ = fVar145 * fVar127;
        fVar127 = auVar56._4_4_;
        auVar57._4_4_ = fVar127 * fVar128;
        fVar128 = auVar56._8_4_;
        auVar57._8_4_ = fVar128 * fVar129;
        fVar129 = auVar56._12_4_;
        auVar57._12_4_ = fVar129 * fVar64;
        auVar122._0_4_ = fVar66 * fVar51;
        auVar122._4_4_ = fVar77 * fVar52;
        auVar122._8_4_ = fVar80 * fVar54;
        auVar122._12_4_ = fVar82 * fVar84;
        auVar55 = vsubps_avx(auVar122,auVar57);
        auVar69._0_4_ = fVar66 * fVar88;
        auVar69._4_4_ = fVar77 * fVar89;
        auVar69._8_4_ = fVar80 * fVar90;
        auVar69._12_4_ = fVar82 * fVar117;
        auVar93._0_4_ = fVar145 * fVar91;
        auVar93._4_4_ = fVar127 * fVar97;
        auVar93._8_4_ = fVar128 * fVar98;
        auVar93._12_4_ = fVar129 * fVar99;
        auVar67 = vsubps_avx(auVar93,auVar69);
        local_2790._0_4_ = local_2790._4_4_;
        fStack_2788 = local_2790._4_4_;
        fStack_2784 = local_2790._4_4_;
        auVar58._0_4_ =
             fVar37 * auVar33._0_4_ + local_2790._4_4_ * auVar67._0_4_ + fStack_2738 * auVar55._0_4_
        ;
        auVar58._4_4_ =
             fVar37 * auVar33._4_4_ + local_2790._4_4_ * auVar67._4_4_ + fStack_2738 * auVar55._4_4_
        ;
        auVar58._8_4_ =
             fVar37 * auVar33._8_4_ + local_2790._4_4_ * auVar67._8_4_ + fStack_2738 * auVar55._8_4_
        ;
        auVar58._12_4_ =
             fVar37 * auVar33._12_4_ +
             local_2790._4_4_ * auVar67._12_4_ + fStack_2738 * auVar55._12_4_;
        local_26a0._0_4_ = auVar58._0_4_ + (float)local_2780._0_4_ + local_25d0._0_4_;
        local_26a0._4_4_ = auVar58._4_4_ + local_2780._4_4_ + local_25d0._4_4_;
        local_26a0._8_4_ = auVar58._8_4_ + local_2780._8_4_ + local_25d0._8_4_;
        local_26a0._12_4_ = auVar58._12_4_ + local_2780._12_4_ + local_25d0._12_4_;
        auVar33 = vminps_avx(local_2780,local_25d0);
        auVar33 = vminps_avx(auVar33,auVar58);
        auVar94._8_4_ = 0x7fffffff;
        auVar94._0_8_ = 0x7fffffff7fffffff;
        auVar94._12_4_ = 0x7fffffff;
        local_25e0 = vandps_avx(local_26a0,auVar94);
        auVar95._0_4_ = local_25e0._0_4_ * 1.1920929e-07;
        auVar95._4_4_ = local_25e0._4_4_ * 1.1920929e-07;
        auVar95._8_4_ = local_25e0._8_4_ * 1.1920929e-07;
        auVar95._12_4_ = local_25e0._12_4_ * 1.1920929e-07;
        uVar16 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
        auVar108._0_8_ = uVar16 ^ 0x8000000080000000;
        auVar108._8_4_ = -auVar95._8_4_;
        auVar108._12_4_ = -auVar95._12_4_;
        auVar33 = vcmpps_avx(auVar33,auVar108,5);
        auVar55 = vmaxps_avx(local_2780,local_25d0);
        auVar55 = vmaxps_avx(auVar55,auVar58);
        auVar55 = vcmpps_avx(auVar55,auVar95,2);
        auVar33 = vorps_avx(auVar33,auVar55);
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar59._0_4_ = fVar144 * fVar38;
          auVar59._4_4_ = fVar147 * fVar53;
          auVar59._8_4_ = fVar148 * fVar78;
          auVar59._12_4_ = fVar149 * fVar83;
          auVar70._0_4_ = fVar157 * fVar156;
          auVar70._4_4_ = fVar160 * fVar159;
          auVar70._8_4_ = fVar162 * fVar161;
          auVar70._12_4_ = fVar164 * fVar163;
          auVar39 = vsubps_avx(auVar70,auVar59);
          auVar96._0_4_ = fVar157 * fVar88;
          auVar96._4_4_ = fVar160 * fVar89;
          auVar96._8_4_ = fVar162 * fVar90;
          auVar96._12_4_ = fVar164 * fVar117;
          auVar109._0_4_ = fVar144 * fVar51;
          auVar109._4_4_ = fVar147 * fVar52;
          auVar109._8_4_ = fVar148 * fVar54;
          auVar109._12_4_ = fVar149 * fVar84;
          auVar92 = vsubps_avx(auVar109,auVar96);
          auVar123._8_4_ = 0x7fffffff;
          auVar123._0_8_ = 0x7fffffff7fffffff;
          auVar123._12_4_ = 0x7fffffff;
          auVar55 = vandps_avx(auVar123,auVar59);
          auVar67 = vandps_avx(auVar123,auVar96);
          auVar55 = vcmpps_avx(auVar55,auVar67,1);
          local_2640 = vblendvps_avx(auVar92,auVar39,auVar55);
          auVar60._0_4_ = fVar138 * fVar51;
          auVar60._4_4_ = fVar140 * fVar52;
          auVar60._8_4_ = fVar141 * fVar54;
          auVar60._12_4_ = fVar142 * fVar84;
          auVar71._0_4_ = fVar138 * fVar38;
          auVar71._4_4_ = fVar140 * fVar53;
          auVar71._8_4_ = fVar141 * fVar78;
          auVar71._12_4_ = fVar142 * fVar83;
          auVar100._0_4_ = fVar157 * fVar133;
          auVar100._4_4_ = fVar160 * fVar135;
          auVar100._8_4_ = fVar162 * fVar136;
          auVar100._12_4_ = fVar164 * fVar137;
          auVar39 = vsubps_avx(auVar71,auVar100);
          auVar110._0_4_ = fVar157 * fVar145;
          auVar110._4_4_ = fVar160 * fVar127;
          auVar110._8_4_ = fVar162 * fVar128;
          auVar110._12_4_ = fVar164 * fVar129;
          auVar92 = vsubps_avx(auVar110,auVar60);
          auVar55 = vandps_avx(auVar123,auVar100);
          auVar67 = vandps_avx(auVar123,auVar60);
          auVar55 = vcmpps_avx(auVar55,auVar67,1);
          local_2630 = vblendvps_avx(auVar92,auVar39,auVar55);
          auVar43._0_4_ = fVar144 * fVar145;
          auVar43._4_4_ = fVar147 * fVar127;
          auVar43._8_4_ = fVar148 * fVar128;
          auVar43._12_4_ = fVar149 * fVar129;
          auVar72._0_4_ = fVar144 * fVar133;
          auVar72._4_4_ = fVar147 * fVar135;
          auVar72._8_4_ = fVar148 * fVar136;
          auVar72._12_4_ = fVar149 * fVar137;
          auVar101._0_4_ = fVar138 * fVar156;
          auVar101._4_4_ = fVar140 * fVar159;
          auVar101._8_4_ = fVar141 * fVar161;
          auVar101._12_4_ = fVar142 * fVar163;
          auVar34._0_4_ = fVar138 * fVar88;
          auVar34._4_4_ = fVar140 * fVar89;
          auVar34._8_4_ = fVar141 * fVar90;
          auVar34._12_4_ = fVar142 * fVar117;
          auVar39 = vsubps_avx(auVar72,auVar101);
          auVar92 = vsubps_avx(auVar34,auVar43);
          auVar55 = vandps_avx(auVar123,auVar101);
          auVar67 = vandps_avx(auVar123,auVar43);
          auVar55 = vcmpps_avx(auVar55,auVar67,1);
          local_2620[0] = vblendvps_avx(auVar92,auVar39,auVar55);
          fVar38 = local_2640._0_4_ * fVar37 +
                   local_2620[0]._0_4_ * local_2790._4_4_ + fStack_2738 * local_2630._0_4_;
          fVar51 = local_2640._4_4_ * fVar37 +
                   local_2620[0]._4_4_ * local_2790._4_4_ + fStack_2738 * local_2630._4_4_;
          fVar53 = local_2640._8_4_ * fVar37 +
                   local_2620[0]._8_4_ * local_2790._4_4_ + fStack_2738 * local_2630._8_4_;
          fVar37 = local_2640._12_4_ * fVar37 +
                   local_2620[0]._12_4_ * local_2790._4_4_ + fStack_2738 * local_2630._12_4_;
          auVar44._0_4_ = fVar38 + fVar38;
          auVar44._4_4_ = fVar51 + fVar51;
          auVar44._8_4_ = fVar53 + fVar53;
          auVar44._12_4_ = fVar37 + fVar37;
          fVar52 = local_2640._0_4_ * fVar105 +
                   local_2620[0]._0_4_ * fVar150 + local_2630._0_4_ * fVar65;
          fVar78 = local_2640._4_4_ * fVar114 +
                   local_2620[0]._4_4_ * fVar153 + local_2630._4_4_ * fVar76;
          fVar54 = local_2640._8_4_ * fVar115 +
                   local_2620[0]._8_4_ * fVar154 + local_2630._8_4_ * fVar79;
          fVar83 = local_2640._12_4_ * fVar116 +
                   local_2620[0]._12_4_ * fVar155 + local_2630._12_4_ * fVar81;
          auVar55 = vrcpps_avx(auVar44);
          fVar37 = auVar55._0_4_;
          auVar111._0_4_ = auVar44._0_4_ * fVar37;
          fVar38 = auVar55._4_4_;
          auVar111._4_4_ = auVar44._4_4_ * fVar38;
          fVar51 = auVar55._8_4_;
          auVar111._8_4_ = auVar44._8_4_ * fVar51;
          fVar53 = auVar55._12_4_;
          auVar111._12_4_ = auVar44._12_4_ * fVar53;
          auVar124._8_4_ = 0x3f800000;
          auVar124._0_8_ = &DAT_3f8000003f800000;
          auVar124._12_4_ = 0x3f800000;
          auVar55 = vsubps_avx(auVar124,auVar111);
          local_2650._0_4_ = (fVar52 + fVar52) * (fVar37 + fVar37 * auVar55._0_4_);
          local_2650._4_4_ = (fVar78 + fVar78) * (fVar38 + fVar38 * auVar55._4_4_);
          local_2650._8_4_ = (fVar54 + fVar54) * (fVar51 + fVar51 * auVar55._8_4_);
          local_2650._12_4_ = (fVar83 + fVar83) * (fVar53 + fVar53 * auVar55._12_4_);
          auVar36 = ZEXT1664(local_2650);
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar73._4_4_ = uVar28;
          auVar73._0_4_ = uVar28;
          auVar73._8_4_ = uVar28;
          auVar73._12_4_ = uVar28;
          auVar55 = vcmpps_avx(auVar73,local_2650,2);
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar102._4_4_ = uVar28;
          auVar102._0_4_ = uVar28;
          auVar102._8_4_ = uVar28;
          auVar102._12_4_ = uVar28;
          auVar67 = vcmpps_avx(local_2650,auVar102,2);
          auVar55 = vandps_avx(auVar67,auVar55);
          auVar67 = auVar33 & auVar55;
          if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar67[0xf] < '\0') {
            auVar33 = vandps_avx(auVar33,auVar55);
            auVar55 = vcmpps_avx(auVar44,_DAT_01feba10,4);
            auVar67 = auVar55 & auVar33;
            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              local_2770 = vandps_avx(auVar33,auVar55);
              local_26c0._16_16_ = local_25d0;
              local_26c0._0_16_ = local_2780;
              local_2690 = &local_27b9;
              local_2680 = local_2770;
              auVar33 = vrcpps_avx(local_26a0);
              fVar37 = auVar33._0_4_;
              auVar61._0_4_ = local_26a0._0_4_ * fVar37;
              fVar38 = auVar33._4_4_;
              auVar61._4_4_ = local_26a0._4_4_ * fVar38;
              fVar51 = auVar33._8_4_;
              auVar61._8_4_ = local_26a0._8_4_ * fVar51;
              fVar53 = auVar33._12_4_;
              auVar61._12_4_ = local_26a0._12_4_ * fVar53;
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = &DAT_3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar33 = vsubps_avx(auVar74,auVar61);
              auVar45._0_4_ = fVar37 + fVar37 * auVar33._0_4_;
              auVar45._4_4_ = fVar38 + fVar38 * auVar33._4_4_;
              auVar45._8_4_ = fVar51 + fVar51 * auVar33._8_4_;
              auVar45._12_4_ = fVar53 + fVar53 * auVar33._12_4_;
              auVar62._8_4_ = 0x219392ef;
              auVar62._0_8_ = 0x219392ef219392ef;
              auVar62._12_4_ = 0x219392ef;
              auVar33 = vcmpps_avx(local_25e0,auVar62,5);
              auVar33 = vandps_avx(auVar33,auVar45);
              auVar63._0_4_ = (float)local_2780._0_4_ * auVar33._0_4_;
              auVar63._4_4_ = local_2780._4_4_ * auVar33._4_4_;
              auVar63._8_4_ = local_2780._8_4_ * auVar33._8_4_;
              auVar63._12_4_ = local_2780._12_4_ * auVar33._12_4_;
              local_2670 = vminps_avx(auVar63,auVar74);
              auVar46._0_4_ = local_25d0._0_4_ * auVar33._0_4_;
              auVar46._4_4_ = local_25d0._4_4_ * auVar33._4_4_;
              auVar46._8_4_ = local_25d0._8_4_ * auVar33._8_4_;
              auVar46._12_4_ = local_25d0._12_4_ * auVar33._12_4_;
              local_2660 = vminps_avx(auVar46,auVar74);
              auVar47._8_4_ = 0x7f800000;
              auVar47._0_8_ = 0x7f8000007f800000;
              auVar47._12_4_ = 0x7f800000;
              auVar33 = vblendvps_avx(auVar47,local_2650,local_2770);
              auVar55 = vshufps_avx(auVar33,auVar33,0xb1);
              auVar55 = vminps_avx(auVar55,auVar33);
              auVar67 = vshufpd_avx(auVar55,auVar55,1);
              auVar55 = vminps_avx(auVar67,auVar55);
              auVar55 = vcmpps_avx(auVar33,auVar55,0);
              auVar67 = local_2770 & auVar55;
              auVar33 = local_2770;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                auVar33 = vandps_avx(auVar55,local_2770);
              }
              lVar32 = lVar32 + uVar31;
              uVar28 = vmovmskps_avx(auVar33);
              uVar16 = CONCAT44((int)((ulong)&local_27b9 >> 0x20),uVar28);
              lVar29 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              local_2790 = context->scene;
              pSVar18 = context->scene;
              fStack_2734 = fStack_2738;
LAB_0043a6ba:
              uVar3 = *(uint *)(lVar32 + 0x90 + lVar29 * 4);
              pRVar17 = (RayHitK<4> *)(ulong)uVar3;
              pGVar5 = (pSVar18->geometries).items[(long)pRVar17].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2770 + lVar29 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar28 = *(undefined4 *)(local_2670 + lVar29 * 4);
                  uVar1 = *(undefined4 *)(local_2660 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2650 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2640 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2630 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2620[0] + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar32 + 0xa0 + lVar29 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar3;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  unaff_R12 = local_2748;
                  goto LAB_0043ab12;
                }
                uVar28 = *(undefined4 *)(local_2670 + lVar29 * 4);
                local_2520._4_4_ = uVar28;
                local_2520._0_4_ = uVar28;
                local_2520._8_4_ = uVar28;
                local_2520._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_2660 + lVar29 * 4);
                auVar48._4_4_ = uVar28;
                auVar48._0_4_ = uVar28;
                auVar48._8_4_ = uVar28;
                auVar48._12_4_ = uVar28;
                local_24f0 = vpshufd_avx(ZEXT416(uVar3),0);
                uVar28 = *(undefined4 *)(lVar32 + 0xa0 + lVar29 * 4);
                auVar75._4_4_ = uVar28;
                auVar75._0_4_ = uVar28;
                auVar75._8_4_ = uVar28;
                auVar75._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_2640 + lVar29 * 4);
                local_2550._4_4_ = uVar28;
                local_2550._0_4_ = uVar28;
                local_2550._8_4_ = uVar28;
                local_2550._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_2630 + lVar29 * 4);
                local_2540._4_4_ = uVar28;
                local_2540._0_4_ = uVar28;
                local_2540._8_4_ = uVar28;
                local_2540._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_2620[0] + lVar29 * 4);
                local_2530._4_4_ = uVar28;
                local_2530._0_4_ = uVar28;
                local_2530._8_4_ = uVar28;
                local_2530._12_4_ = uVar28;
                local_2510 = auVar48;
                local_2500 = auVar75;
                vcmpps_avx(ZEXT1632(local_2520),ZEXT1632(local_2520),0xf);
                uStack_24dc = context->user->instID[0];
                local_24e0 = uStack_24dc;
                uStack_24d8 = uStack_24dc;
                uStack_24d4 = uStack_24dc;
                uStack_24d0 = context->user->instPrimID[0];
                uStack_24cc = uStack_24d0;
                uStack_24c8 = uStack_24d0;
                uStack_24c4 = uStack_24d0;
                local_2780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2650 + lVar29 * 4);
                local_2730 = *local_2718;
                uStack_2728 = local_2718[1];
                local_26f0 = &local_2730;
                local_26e8 = pGVar5->userPtr;
                local_26e0 = context->user;
                local_26d0 = &local_2550;
                local_26c8 = 4;
                pRVar17 = (RayHitK<4> *)pGVar5->intersectionFilterN;
                local_27a0 = auVar36._0_16_;
                local_2758 = lVar26;
                local_2750 = lVar19;
                local_26d8 = ray;
                if (pRVar17 != (RayHitK<4> *)0x0) {
                  local_2740 = pauVar22;
                  pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_26f0);
                  auVar36._8_56_ = extraout_var;
                  auVar36._0_8_ = extraout_XMM1_Qa;
                  auVar48 = auVar36._0_16_;
                  auVar36 = ZEXT1664(local_27a0);
                  pauVar22 = local_2740;
                  uVar23 = local_27b0;
                  ray = local_27a8;
                  uVar27 = local_27b8;
                }
                auVar13._8_8_ = uStack_2728;
                auVar13._0_8_ = local_2730;
                if (auVar13 == (undefined1  [16])0x0) {
                  auVar33 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar55 = vpcmpeqd_avx(auVar48,auVar48);
                  auVar33 = auVar33 ^ auVar55;
                  lVar19 = local_2750;
                  lVar26 = local_2758;
                }
                else {
                  pRVar17 = (RayHitK<4> *)context->args->filter;
                  auVar55 = vpcmpeqd_avx(auVar75,auVar75);
                  if ((pRVar17 != (RayHitK<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_26f0);
                    auVar36 = ZEXT1664(local_27a0);
                    auVar55 = vpcmpeqd_avx(auVar55,auVar55);
                    uVar23 = local_27b0;
                    ray = local_27a8;
                    uVar27 = local_27b8;
                  }
                  auVar14._8_8_ = uStack_2728;
                  auVar14._0_8_ = local_2730;
                  auVar67 = vpcmpeqd_avx(auVar14,_DAT_01feba10);
                  auVar33 = auVar67 ^ auVar55;
                  lVar19 = local_2750;
                  lVar26 = local_2758;
                  if (auVar14 != (undefined1  [16])0x0) {
                    auVar67 = auVar67 ^ auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,*local_26d0);
                    *(undefined1 (*) [16])(local_26d8 + 0xc0) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[1]);
                    *(undefined1 (*) [16])(local_26d8 + 0xd0) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[2]);
                    *(undefined1 (*) [16])(local_26d8 + 0xe0) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[3]);
                    *(undefined1 (*) [16])(local_26d8 + 0xf0) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[4]);
                    *(undefined1 (*) [16])(local_26d8 + 0x100) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[5]);
                    *(undefined1 (*) [16])(local_26d8 + 0x110) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[6]);
                    *(undefined1 (*) [16])(local_26d8 + 0x120) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[7]);
                    *(undefined1 (*) [16])(local_26d8 + 0x130) = auVar55;
                    auVar55 = vmaskmovps_avx(auVar67,local_26d0[8]);
                    *(undefined1 (*) [16])(local_26d8 + 0x140) = auVar55;
                    pRVar17 = local_26d8;
                  }
                }
                auVar50._8_8_ = 0x100000001;
                auVar50._0_8_ = 0x100000001;
                if ((auVar50 & auVar33) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_2780._0_4_;
                }
                *(undefined4 *)(local_2770 + lVar29 * 4) = 0;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar35._4_4_ = uVar28;
                auVar35._0_4_ = uVar28;
                auVar35._8_4_ = uVar28;
                auVar35._12_4_ = uVar28;
                auVar33 = vcmpps_avx(auVar36._0_16_,auVar35,2);
                local_2770 = vandps_avx(auVar33,local_2770);
              }
              unaff_R12 = local_2748;
              if ((((local_2770 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2770 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2770 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2770[0xf]) goto LAB_0043ab12;
              auVar49._8_4_ = 0x7f800000;
              auVar49._0_8_ = 0x7f8000007f800000;
              auVar49._12_4_ = 0x7f800000;
              auVar33 = vblendvps_avx(auVar49,auVar36._0_16_,local_2770);
              auVar55 = vshufps_avx(auVar33,auVar33,0xb1);
              auVar55 = vminps_avx(auVar55,auVar33);
              auVar67 = vshufpd_avx(auVar55,auVar55,1);
              auVar55 = vminps_avx(auVar67,auVar55);
              auVar55 = vcmpps_avx(auVar33,auVar55,0);
              auVar67 = local_2770 & auVar55;
              auVar33 = local_2770;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                auVar33 = vandps_avx(auVar55,local_2770);
              }
              uVar28 = vmovmskps_avx(auVar33);
              uVar16 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar28);
              lVar29 = 0;
              pSVar18 = local_2790;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              goto LAB_0043a6ba;
            }
          }
        }
LAB_0043ab12:
        lVar26 = lVar26 + 1;
      } while (lVar26 != lVar19);
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar36 = ZEXT3264(CONCAT428(uVar28,CONCAT424(uVar28,CONCAT420(uVar28,CONCAT416(uVar28,CONCAT412
                                                  (uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))))
                                                  ))));
    auVar104 = ZEXT3264(local_23c0);
    auVar113 = ZEXT3264(local_23e0);
    auVar126 = ZEXT3264(local_2400);
    auVar132 = ZEXT3264(local_2420);
    auVar134 = ZEXT3264(local_2440);
    auVar139 = ZEXT3264(local_2460);
    auVar143 = ZEXT3264(local_2480);
    auVar146 = ZEXT3264(local_24a0);
    auVar152 = ZEXT3264(local_24c0);
    auVar158 = ZEXT3264(local_2600);
    uVar16 = local_2710;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }